

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::AddFuncInfoToFinalizationSet(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  RealCount *pRVar1;
  ArenaAllocator *pAVar2;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  Type pSVar4;
  
  if (this->funcInfosToFinalize == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    pSVar3 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
             new<Memory::ArenaAllocator>(0x18,this->alloc,0x366bee);
    pAVar2 = this->alloc;
    (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
         0;
    (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar3;
    pSVar3->allocator = pAVar2;
    this->funcInfosToFinalize = pSVar3;
  }
  pSVar3 = this->funcInfosToFinalize;
  pSVar4 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar3->allocator,0x366bee);
  pSVar4[1].next = (Type)funcInfo;
  pSVar4->next = (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar4;
  pRVar1 = &(pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount
  ;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void ByteCodeGenerator::AddFuncInfoToFinalizationSet(FuncInfo * funcInfo)
{
    if (this->funcInfosToFinalize == nullptr)
    {
        this->funcInfosToFinalize = Anew(alloc, SList<FuncInfo*>, alloc);
    }

    this->funcInfosToFinalize->Prepend(funcInfo);
}